

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O1

void mzd_addmul_v_uint64_30_192(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  ulong uVar1;
  uint i;
  int iVar2;
  uint i_1;
  long lVar3;
  
  uVar1 = v->w64[2] >> 0x22;
  iVar2 = 0x1e;
  do {
    lVar3 = 0;
    do {
      c->w64[lVar3] = c->w64[lVar3] ^ A->w64[lVar3] & -(ulong)((uint)uVar1 & 1);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    uVar1 = uVar1 >> 1;
    A = A + 1;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return;
}

Assistant:

void mzd_addmul_v_uint64_30_192(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);

  word idx = CONST_BLOCK(v, 0)->w64[2] >> 34;
  for (unsigned int i = 30; i; --i, idx >>= 1, ++Ablock) {
    const word mask = -(idx & 1);
    mzd_xor_mask_uint64_block(cblock, Ablock, mask, 3);
  }
}